

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetFixedStep(void *arkode_mem,sunrealtype hfixed)

{
  ARKodeMem in_RDI;
  N_Vector in_XMM0_Qa;
  ARKodeMem ark_mem;
  int retval;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x4d9,"ARKodeSetFixedStep",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    iVar1 = -0x15;
  }
  else if ((((double)in_XMM0_Qa != 0.0) || (NAN((double)in_XMM0_Qa))) ||
          (in_RDI->step_supports_adaptive != 0)) {
    if ((((double)in_XMM0_Qa == 0.0) && (!NAN((double)in_XMM0_Qa))) && (in_RDI->user_efun == 0)) {
      if ((in_RDI->itol == 1) && (in_RDI->Vabstol != (N_Vector)0x0)) {
        iVar1 = ARKodeSVtolerances((void *)CONCAT44(in_stack_fffffffffffffffc,
                                                    in_stack_fffffffffffffff8),(sunrealtype)in_RDI,
                                   in_XMM0_Qa);
      }
      else {
        iVar1 = ARKodeSStolerances(in_XMM0_Qa,
                                   (sunrealtype)
                                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                   (sunrealtype)in_RDI);
      }
      if (iVar1 != 0) {
        return iVar1;
      }
      in_stack_ffffffffffffffe4 = 0;
    }
    if (((double)in_XMM0_Qa != 0.0) || (NAN((double)in_XMM0_Qa))) {
      in_RDI->fixedstep = 1;
      in_RDI->hin = (sunrealtype)in_XMM0_Qa;
    }
    else {
      in_RDI->fixedstep = 0;
    }
    ARKodeSetInitStep(in_XMM0_Qa,
                      (sunrealtype)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    iVar1 = 0;
  }
  else {
    arkProcessError(in_RDI,-0x30,0x4e2,"ARKodeSetFixedStep",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"temporal adaptivity is not supported by this time step module");
    iVar1 = -0x30;
  }
  return iVar1;
}

Assistant:

int ARKodeSetFixedStep(void* arkode_mem, sunrealtype hfixed)
{
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* ensure that when hfixed=0, the time step module supports adaptivity */
  if ((hfixed == ZERO) && (!ark_mem->step_supports_adaptive))
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "temporal adaptivity is not supported by this time step module");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* re-attach internal error weight functions if necessary */
  if ((hfixed == ZERO) && (!ark_mem->user_efun))
  {
    if (ark_mem->itol == ARK_SV && ark_mem->Vabstol != NULL)
    {
      retval = ARKodeSVtolerances(ark_mem, ark_mem->reltol, ark_mem->Vabstol);
    }
    else
    {
      retval = ARKodeSStolerances(ark_mem, ark_mem->reltol, ark_mem->Sabstol);
    }
    if (retval != ARK_SUCCESS) { return (retval); }
  }

  /* set ark_mem "fixedstep" entry */
  if (hfixed != ZERO)
  {
    ark_mem->fixedstep = SUNTRUE;
    ark_mem->hin       = hfixed;
  }
  else { ark_mem->fixedstep = SUNFALSE; }

  /* Notify ARKODE to use hfixed as the initial step size, and return */
  retval = ARKodeSetInitStep(arkode_mem, hfixed);

  return (ARK_SUCCESS);
}